

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O0

bool __thiscall
ON_DimStyleExtra::DeleteAfterRead
          (ON_DimStyleExtra *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  ON_V5x_DimStyle *this_00;
  ON_UUID *b;
  bool *pbVar4;
  byte local_4a;
  uint local_3c;
  uint i_1;
  uint uStack_30;
  bool bOverrideParentSetting;
  uint i;
  uint count;
  uint capacity;
  ON_V5x_DimStyle *dimstyle;
  ON_Object *parent_object_local;
  ON_BinaryArchive *archive_local;
  ON_DimStyleExtra *this_local;
  
  this_00 = ON_V5x_DimStyle::Cast(parent_object);
  if (this_00 != (ON_V5x_DimStyle *)0x0) {
    b = ON_ModelComponent::ParentId(&this_00->super_ON_ModelComponent);
    bVar3 = ::operator==(&ON_nil_uuid,b);
    if (bVar3) {
      ON_ModelComponent::SetParentId(&this_00->super_ON_ModelComponent,&this->m_parent_dimstyle);
    }
    if (this_00->m_field_override_count == 0) {
      uStack_30 = ON_SimpleArray<bool>::Count(&this->m_valid_fields);
      if (0x58 < uStack_30) {
        uStack_30 = 0x58;
      }
      for (i_1 = 0; i_1 < uStack_30 && i_1 < 0x58; i_1 = i_1 + 1) {
        local_4a = 0;
        if ((1 < i_1) && (local_4a = 0, i_1 < 0x58)) {
          pbVar4 = ON_SimpleArray<bool>::operator[](&this->m_valid_fields,i_1);
          local_4a = *pbVar4;
        }
        bVar3 = (bool)(-(local_4a & 1) & 1);
        this_00->m_field_override[i_1] = bVar3;
        if (bVar3 != false) {
          this_00->m_field_override_count = this_00->m_field_override_count + 1;
        }
      }
      for (local_3c = uStack_30; local_3c < 0x58; local_3c = local_3c + 1) {
        this_00->m_field_override[local_3c] = false;
      }
    }
    this_00->m_tolerance_style = this->m_tolerance_style;
    this_00->m_tolerance_resolution = this->m_tolerance_resolution;
    this_00->m_tolerance_upper_value = this->m_tolerance_upper_value;
    this_00->m_tolerance_lower_value = this->m_tolerance_lower_value;
    this_00->m_tolerance_height_scale = this->m_tolerance_height_scale;
    this_00->m_bDrawMask = (bool)(this->m_bDrawMask & 1);
    this_00->m_mask_color_source = this->m_mask_color_source;
    (this_00->m_mask_color).field_0 = (this->m_mask_color).field_0;
    this_00->m_dimscale = this->m_dimscale;
    this_00->m_dimscale_source = this->m_dimscale_source;
    uVar1 = (this->m_source_dimstyle).Data2;
    uVar2 = (this->m_source_dimstyle).Data3;
    (this_00->m_source_dimstyle).Data1 = (this->m_source_dimstyle).Data1;
    (this_00->m_source_dimstyle).Data2 = uVar1;
    (this_00->m_source_dimstyle).Data3 = uVar2;
    *(undefined8 *)(this_00->m_source_dimstyle).Data4 =
         *(undefined8 *)(this->m_source_dimstyle).Data4;
  }
  return true;
}

Assistant:

bool ON_DimStyleExtra::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
) const
{
  // Move settings to ON_V5x_DimStyle
  for (;;)
  {
    ON_V5x_DimStyle* dimstyle = ON_V5x_DimStyle::Cast(parent_object);
    if (nullptr == dimstyle)
      break;

    if (ON_nil_uuid == dimstyle->ParentId())
      dimstyle->SetParentId(this->m_parent_dimstyle);

    if (0 == dimstyle->m_field_override_count)
    {
      const unsigned int capacity = sizeof(dimstyle->m_field_override) / sizeof(dimstyle->m_field_override[0]);
      unsigned int count = m_valid_fields.Count();
      if ( count > static_cast<unsigned int>(ON_V5x_DimStyle::Field::FieldCount) )
        count = static_cast<unsigned int>(ON_V5x_DimStyle::Field::FieldCount);
      for (unsigned int i = 0; i < count && i < capacity; i++)
      {
        bool bOverrideParentSetting 
          = (i > static_cast<unsigned int>(ON_V5x_DimStyle::Field::fn_index) && i <= static_cast<unsigned int>(ON_V5x_DimStyle::Field::fn_dim_arrow_blockname2) && this->m_valid_fields[i])
          ? true 
          : false;
        dimstyle->m_field_override[i] = bOverrideParentSetting;
        if (bOverrideParentSetting)
          dimstyle->m_field_override_count++;
      }
      for (unsigned int i = count; i < capacity; i++)
        dimstyle->m_field_override[i] = false;
    }
    dimstyle->m_tolerance_style = this->m_tolerance_style;
    dimstyle->m_tolerance_resolution = this->m_tolerance_resolution;
    dimstyle->m_tolerance_upper_value = this->m_tolerance_upper_value;
    dimstyle->m_tolerance_lower_value = this->m_tolerance_lower_value;
    dimstyle->m_tolerance_height_scale = this->m_tolerance_height_scale;
    dimstyle->m_bDrawMask = this->m_bDrawMask;
    dimstyle->m_mask_color_source = this->m_mask_color_source;
    dimstyle->m_mask_color = this->m_mask_color;
    dimstyle->m_dimscale = this->m_dimscale;
    dimstyle->m_dimscale_source = this->m_dimscale_source;
    dimstyle->m_source_dimstyle = this->m_source_dimstyle;
   
    break;
  }

  return true;
}